

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastSqrtNR(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  Gia_Man_t *p;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int *piVar12;
  long lVar13;
  int *piVar14;
  ulong uVar15;
  int Carry;
  uint local_94;
  Vec_Int_t *local_90;
  int *local_88;
  int *local_80;
  long local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  Gia_Man_t *local_58;
  ulong local_50;
  int *local_48;
  ulong local_40;
  int *local_38;
  
  local_94 = 1;
  local_48 = pNum;
  if ((nNum & 1U) != 0) {
    __assert_fail("nNum % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x31a,"void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
  }
  uVar11 = nNum >> 1;
  if (vRes->nCap < (int)uVar11) {
    if (vRes->pArray == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar11 << 2);
    }
    else {
      piVar6 = (int *)realloc(vRes->pArray,(long)(int)uVar11 << 2);
    }
    vRes->pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0089e822;
    vRes->nCap = uVar11;
  }
  uVar15 = (ulong)uVar11;
  local_58 = pNew;
  if (0 < (int)uVar11) {
    memset(vRes->pArray,0,uVar15 * 4);
  }
  vRes->nSize = uVar11;
  uVar2 = nNum * 2;
  local_50 = uVar15;
  if (SBORROW4(vTmp->nCap,uVar2) != vTmp->nCap + nNum * -2 < 0) {
    if (vTmp->pArray == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar6 = (int *)realloc(vTmp->pArray,(long)(int)uVar2 << 2);
    }
    vTmp->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_0089e822:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vTmp->nCap = uVar2;
  }
  piVar6 = vTmp->pArray;
  local_90 = vRes;
  if (0 < nNum) {
    memset(piVar6,0,(ulong)uVar2 << 2);
  }
  vTmp->nSize = uVar2;
  if (0 < (int)uVar11) {
    local_60 = local_90->pArray;
    local_78 = (long)nNum;
    piVar14 = piVar6 + local_78;
    local_70 = piVar6 + local_78 + 1;
    piVar12 = piVar6 + 1;
    lVar13 = 0;
    uVar15 = 0;
    uVar11 = 1;
    local_88 = piVar6;
    local_68 = piVar14;
    do {
      piVar4 = local_60;
      piVar6 = local_68;
      if (*local_68 != 0) {
        __assert_fail("pIn1[0] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                      ,0x323,
                      "void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
      }
      local_80 = piVar12;
      if (uVar15 < 2) {
        if (uVar15 != 0) goto LAB_0089e63a;
        uVar7 = 0;
        uVar10 = 0;
      }
      else {
        memset(local_70,0,uVar15 * 4 + 0x3fffffffc & 0x3fffffffc);
LAB_0089e63a:
        uVar7 = uVar15 * 2;
        lVar9 = 0;
        do {
          piVar14[lVar9] = piVar4[lVar9];
          lVar1 = lVar9 + uVar15;
          lVar9 = lVar9 + 1;
        } while (lVar1 + 1U < uVar7);
        uVar10 = lVar9 + uVar15;
      }
      p = local_58;
      if ((int)uVar11 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      piVar6[uVar10] = uVar11 ^ 1;
      piVar6[uVar10 + 1] = 1;
      local_40 = uVar15;
      local_38 = piVar14;
      if (uVar10 != uVar7) {
        __assert_fail("k == 2*i+2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                      ,0x32a,
                      "void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
      }
      local_88[uVar7] = local_48[(local_78 - uVar7) + -1];
      local_88[uVar7 + 1] = local_48[(local_78 - uVar7) + -2];
      lVar9 = 2;
      piVar6 = local_80;
      do {
        iVar5 = Gia_ManHashXor(p,uVar11,piVar6[local_78]);
        Wlc_BlastFullAdder(p,iVar5,*piVar6,local_94,(int *)&local_94,piVar6);
        lVar1 = lVar13 + lVar9;
        lVar9 = lVar9 + -1;
        piVar6 = piVar6 + -1;
      } while (lVar1 != 1 && -1 < lVar1 + -1);
      local_60[local_40] = local_94;
      uVar15 = local_40 + 1;
      piVar14 = local_38 + 1;
      lVar13 = lVar13 + 2;
      piVar12 = local_80 + 2;
      uVar11 = local_94;
    } while (uVar15 != local_50);
  }
  iVar5 = local_90->nSize;
  if (1 < iVar5) {
    piVar6 = local_90->pArray;
    iVar8 = -1;
    lVar13 = 0;
    do {
      iVar3 = piVar6[lVar13];
      piVar6[lVar13] = piVar6[iVar5 + iVar8];
      piVar6[local_90->nSize + iVar8] = iVar3;
      lVar13 = lVar13 + 1;
      iVar5 = local_90->nSize;
      iVar8 = iVar8 + -1;
    } while (lVar13 < iVar5 / 2);
  }
  return;
}

Assistant:

void Wlc_BlastSqrtNR( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int * pSqr, * pRem, * pIn1;
    int i, k, Carry = 1;
    assert( nNum % 2 == 0 );
    Vec_IntFill( vRes, nNum/2, 0 );
    Vec_IntFill( vTmp, 2*nNum, 0 );
    pSqr = Vec_IntArray( vRes );
    pRem = Vec_IntArray( vTmp );
    pIn1 = pRem + nNum;
    for ( i = 0; i < nNum/2; i++ )
    {
        int SqrPrev = Carry;
        assert( pIn1[0] == 0 );
        for ( k = 1; k < i; k++ )
            pIn1[k] = 0;
        for ( k = i; k < 2*i; k++ )
            pIn1[k] = pSqr[k-i];
        pIn1[k++] = Abc_LitNot(Carry);
        pIn1[k++] = 1;
        assert( k == 2*i+2 );
        pRem[2*i+0] = pNum[nNum-2*i-1];
        pRem[2*i+1] = pNum[nNum-2*i-2];
        for ( k = 2*i+1; k >= 0; k-- )
            Wlc_BlastFullAdder( pNew, Gia_ManHashXor(pNew, SqrPrev, pIn1[k]), pRem[k], Carry, &Carry, &pRem[k] );
        pSqr[i] = Carry;
    }
    Vec_IntReverseOrder( vRes );
}